

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VClone_Serial(N_Vector w)

{
  void *pvVar1;
  undefined8 *in_RDI;
  sunindextype length;
  realtype *data;
  N_Vector v;
  N_Vector local_8;
  
  local_8 = N_VCloneEmpty_Serial((N_Vector)0x0);
  if (local_8 == (N_Vector)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else if (0 < *(int *)*in_RDI) {
    pvVar1 = malloc((long)*(int *)*in_RDI << 3);
    if (pvVar1 == (void *)0x0) {
      N_VDestroy_Serial((N_Vector)0xecd167);
      local_8 = (N_Vector)0x0;
    }
    else {
      *(undefined4 *)((long)local_8->content + 4) = 1;
      *(void **)((long)local_8->content + 8) = pvVar1;
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VClone_Serial(N_Vector w)
{
  N_Vector v;
  realtype *data;
  sunindextype length;

  v = NULL;
  v = N_VCloneEmpty_Serial(w);
  if (v == NULL) return(NULL);

  length = NV_LENGTH_S(w);

  /* Create data */
  if (length > 0) {

    /* Allocate memory */
    data = NULL;
    data = (realtype *) malloc(length * sizeof(realtype));
    if(data == NULL) { N_VDestroy_Serial(v); return(NULL); }

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;

  }

  return(v);
}